

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O3

void __thiscall QGraphicsViewPrivate::recalculateContentSize(QGraphicsViewPrivate *this)

{
  double dVar1;
  ScrollBarPolicy SVar2;
  QWidget *this_00;
  QRegionData *pQVar3;
  bool bVar4;
  qreal qVar5;
  qreal qVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  LayoutDirection LVar10;
  QSize QVar11;
  QStyle *pQVar12;
  int iVar13;
  int min;
  Representation RVar14;
  Representation RVar15;
  Representation RVar16;
  Representation RVar17;
  long in_FS_OFFSET;
  bool bVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  QRectF local_78;
  QRectF local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)
             &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
              field_0x8;
  QVar11 = QAbstractScrollArea::maximumViewportSize((QAbstractScrollArea *)this_00);
  local_58.w._0_4_ = 0xffffffff;
  local_58.w._4_4_ = 0xffffffff;
  local_58.h._0_4_ = 0xffffffff;
  local_58.h._4_4_ = 0xffffffff;
  local_58.xp._0_4_ = 0xffffffff;
  local_58.xp._4_4_ = 0xffffffff;
  local_58.yp._0_4_ = 0xffffffff;
  local_58.yp._4_4_ = 0xffffffff;
  QGraphicsView::sceneRect(&local_78,(QGraphicsView *)this_00);
  QTransform::mapRect(&local_58);
  pQVar12 = QWidget::style(this_00);
  iVar7 = (**(code **)(*(long *)pQVar12 + 0xf0))(pQVar12,0x11,0,this_00,0);
  RVar16 = QVar11.ht.m_i;
  RVar15 = QVar11.wd.m_i;
  RVar14.m_i = RVar15.m_i;
  RVar17.m_i = RVar16.m_i;
  if (iVar7 != 0) {
    iVar13 = (this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.frameWidth * 2;
    iVar8 = 0;
    if ((this->super_QAbstractScrollAreaPrivate).hbarpolicy == ScrollBarAlwaysOn) {
      iVar8 = iVar13;
    }
    RVar17.m_i = RVar16.m_i - iVar8;
    if ((this->super_QAbstractScrollAreaPrivate).vbarpolicy != ScrollBarAlwaysOn) {
      iVar13 = 0;
    }
    RVar14.m_i = RVar15.m_i - iVar13;
  }
  pQVar12 = QWidget::style(this_00);
  iVar8 = (**(code **)(*(long *)pQVar12 + 0xe0))(pQVar12,9,0,this_00);
  iVar13 = (this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.frameWidth * 2;
  if (iVar7 == 0) {
    iVar13 = 0;
  }
  iVar13 = iVar13 + iVar8;
  dVar20 = (double)CONCAT44(local_58.w._4_4_,local_58.w._0_4_);
  SVar2 = (this->super_QAbstractScrollAreaPrivate).hbarpolicy;
  bVar18 = (this->super_QAbstractScrollAreaPrivate).vbarpolicy == ScrollBarAsNeeded;
  bVar4 = (double)RVar17.m_i < (double)CONCAT44(local_58.h._4_4_,local_58.h._0_4_) && bVar18;
  if ((bVar18 && (SVar2 == ScrollBarAsNeeded && (double)RVar14.m_i < dVar20)) &&
     ((double)(RVar17.m_i - iVar13) < (double)CONCAT44(local_58.h._4_4_,local_58.h._0_4_))) {
    bVar4 = true;
  }
  if (((!(bool)(SVar2 == ScrollBarAsNeeded & bVar4)) ||
      (iVar7 = iVar13, dVar20 <= (double)(RVar14.m_i - iVar13))) &&
     (iVar7 = 0, SVar2 == ScrollBarAsNeeded && (double)RVar14.m_i < dVar20)) {
    iVar7 = iVar13;
  }
  iVar8 = 0;
  if (bVar4) {
    iVar8 = iVar13;
  }
  iVar8 = RVar14.m_i - iVar8;
  dVar19 = (double)CONCAT44(local_58.xp._4_4_,local_58.xp._0_4_);
  iVar13 = -0x80000000;
  min = -0x80000000;
  if ((-2147483648.0 < dVar19) && (min = 0x7fffffff, dVar19 < 2147483647.0)) {
    if (0.0 <= dVar19) {
      min = (int)(dVar19 + 0.5);
    }
    else {
      min = (int)((dVar19 - (double)(int)(dVar19 + -1.0)) + 0.5) + (int)(dVar19 + -1.0);
    }
  }
  dVar21 = (dVar20 + dVar19) - (double)iVar8;
  if ((-2147483648.0 < dVar21) && (iVar13 = 0x7fffffff, dVar21 < 2147483647.0)) {
    if (0.0 <= dVar21) {
      iVar13 = (int)(dVar21 + 0.5);
    }
    else {
      iVar13 = (int)((dVar21 - (double)(int)(dVar21 + -1.0)) + 0.5) + (int)(dVar21 + -1.0);
    }
  }
  qVar5 = (this->lastCenterPoint).xp;
  qVar6 = (this->lastCenterPoint).yp;
  dVar21 = this->leftIndent;
  dVar1 = this->topIndent;
  if (min < iVar13) {
    this->leftIndent = 0.0;
    QAbstractSlider::setRange
              (&((this->super_QAbstractScrollAreaPrivate).hbar)->super_QAbstractSlider,min,iVar13);
    QAbstractSlider::setPageStep
              (&((this->super_QAbstractScrollAreaPrivate).hbar)->super_QAbstractSlider,iVar8);
    QAbstractSlider::setSingleStep
              (&((this->super_QAbstractScrollAreaPrivate).hbar)->super_QAbstractSlider,iVar8 / 0x14)
    ;
    if ((dVar21 != 0.0) || (NAN(dVar21))) {
      QAbstractSlider::setValue
                (&((this->super_QAbstractScrollAreaPrivate).hbar)->super_QAbstractSlider,
                 (int)-dVar21);
    }
  }
  else {
    uVar9 = (this->alignment).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
            super_QFlagsStorage<Qt::AlignmentFlag>.i & 0x1f;
    if (uVar9 == 2) {
      dVar19 = (((double)RVar15.m_i - dVar20) - dVar19) + -1.0;
    }
    else if (uVar9 == 1) {
      dVar19 = -dVar19;
    }
    else {
      dVar19 = (dVar19 + dVar20 + dVar19) * -0.5 +
               (double)((int)(((uint)((ulong)QVar11 >> 0x1f) & 1) + RVar15.m_i) >> 1);
    }
    this->leftIndent = dVar19;
    QAbstractSlider::setRange
              (&((this->super_QAbstractScrollAreaPrivate).hbar)->super_QAbstractSlider,0,0);
  }
  iVar7 = RVar17.m_i - iVar7;
  dVar20 = (double)CONCAT44(local_58.yp._4_4_,local_58.yp._0_4_);
  iVar13 = -0x80000000;
  iVar8 = -0x80000000;
  if ((-2147483648.0 < dVar20) && (iVar8 = 0x7fffffff, dVar20 < 2147483647.0)) {
    if (0.0 <= dVar20) {
      iVar8 = (int)(dVar20 + 0.5);
    }
    else {
      iVar8 = (int)((dVar20 - (double)(int)(dVar20 + -1.0)) + 0.5) + (int)(dVar20 + -1.0);
    }
  }
  dVar19 = dVar20 + (double)CONCAT44(local_58.h._4_4_,local_58.h._0_4_);
  dVar22 = dVar19 - (double)iVar7;
  if ((-2147483648.0 < dVar22) && (iVar13 = 0x7fffffff, dVar22 < 2147483647.0)) {
    if (0.0 <= dVar22) {
      iVar13 = (int)(dVar22 + 0.5);
    }
    else {
      iVar13 = (int)((dVar22 - (double)(int)(dVar22 + -1.0)) + 0.5) + (int)(dVar22 + -1.0);
    }
  }
  if (iVar8 < iVar13) {
    this->topIndent = 0.0;
    QAbstractSlider::setRange
              (&((this->super_QAbstractScrollAreaPrivate).vbar)->super_QAbstractSlider,iVar8,iVar13)
    ;
    QAbstractSlider::setPageStep
              (&((this->super_QAbstractScrollAreaPrivate).vbar)->super_QAbstractSlider,iVar7);
    QAbstractSlider::setSingleStep
              (&((this->super_QAbstractScrollAreaPrivate).vbar)->super_QAbstractSlider,iVar7 / 0x14)
    ;
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      QAbstractSlider::setValue
                (&((this->super_QAbstractScrollAreaPrivate).vbar)->super_QAbstractSlider,(int)-dVar1
                );
    }
  }
  else {
    uVar9 = (this->alignment).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
            super_QFlagsStorage<Qt::AlignmentFlag>.i & 0x1e0;
    if (uVar9 == 0x40) {
      dVar20 = (((double)RVar16.m_i - (double)CONCAT44(local_58.h._4_4_,local_58.h._0_4_)) - dVar20)
               + -1.0;
    }
    else if (uVar9 == 0x20) {
      dVar20 = -dVar20;
    }
    else {
      dVar20 = (dVar20 + dVar19) * -0.5 + (double)(RVar16.m_i / 2);
    }
    this->topIndent = dVar20;
    QAbstractSlider::setRange
              (&((this->super_QAbstractScrollAreaPrivate).vbar)->super_QAbstractSlider,0,0);
  }
  (this->lastCenterPoint).xp = qVar5;
  (this->lastCenterPoint).yp = qVar6;
  if ((((dVar21 != this->leftIndent) || (NAN(dVar21) || NAN(this->leftIndent))) ||
      (dVar1 != this->topIndent)) || (NAN(dVar1) || NAN(this->topIndent))) {
    this->field_0x300 = this->field_0x300 | 0x20;
    QWidget::update((this->super_QAbstractScrollAreaPrivate).viewport);
    this->field_0x301 = this->field_0x301 | 0x10;
    (this->dirtyBoundingRect).x1 = 0;
    (this->dirtyBoundingRect).y1 = 0;
    (this->dirtyBoundingRect).x2 = -1;
    (this->dirtyBoundingRect).y2 = -1;
    QRegion::QRegion((QRegion *)&local_78);
    pQVar3 = (this->dirtyRegion).d;
    (this->dirtyRegion).d = (QRegionData *)local_78.xp;
    local_78.xp = (qreal)pQVar3;
    QRegion::~QRegion((QRegion *)&local_78);
  }
  else {
    LVar10 = QWidget::layoutDirection(this_00);
    if (((LVar10 == RightToLeft) && (this->leftIndent == 0.0)) && (!NAN(this->leftIndent))) {
      this->field_0x300 = this->field_0x300 | 0x20;
    }
  }
  if (((this->cacheMode).super_QFlagsStorageHelper<QGraphicsView::CacheModeFlag,_4>.
       super_QFlagsStorage<QGraphicsView::CacheModeFlag>.i & 1) != 0) {
    this->field_0x301 = this->field_0x301 | 8;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsViewPrivate::recalculateContentSize()
{
    Q_Q(QGraphicsView);

    const QSize maxSize = q->maximumViewportSize();
    int width = maxSize.width();
    int height = maxSize.height();
    const QRectF viewRect = matrix.mapRect(q->sceneRect());

    bool frameOnlyAround = (q->style()->styleHint(QStyle::SH_ScrollView_FrameOnlyAroundContents, nullptr, q));
    if (frameOnlyAround) {
        if (hbarpolicy == Qt::ScrollBarAlwaysOn)
            height -= frameWidth * 2;
        if (vbarpolicy == Qt::ScrollBarAlwaysOn)
            width -= frameWidth * 2;
    }

    // Adjust the maximum width and height of the viewport based on the width
    // of visible scroll bars.
    const int scrollBarExtent = q->style()->pixelMetric(QStyle::PM_ScrollBarExtent, nullptr, q)
                              + (frameOnlyAround ? frameWidth * 2 : 0);

    // We do not need to subtract the width scrollbars whose policy is
    // Qt::ScrollBarAlwaysOn, this was already done by maximumViewportSize().
    bool useHorizontalScrollBar = (viewRect.width() > width) && hbarpolicy == Qt::ScrollBarAsNeeded;
    bool useVerticalScrollBar = (viewRect.height() > height) && vbarpolicy == Qt::ScrollBarAsNeeded;
    if (useHorizontalScrollBar && vbarpolicy == Qt::ScrollBarAsNeeded) {
        if (viewRect.height() > height - scrollBarExtent)
            useVerticalScrollBar = true;
    }
    if (useVerticalScrollBar && hbarpolicy == Qt::ScrollBarAsNeeded) {
        if (viewRect.width() > width - scrollBarExtent)
            useHorizontalScrollBar = true;
    }
    if (useHorizontalScrollBar)
        height -= scrollBarExtent;
    if (useVerticalScrollBar)
        width -= scrollBarExtent;

    // Setting the ranges of these scroll bars can/will cause the values to
    // change, and scrollContentsBy() will be called correspondingly. This
    // will reset the last center point.
    const QPointF savedLastCenterPoint = lastCenterPoint;

    // Remember the former indent settings
    const qreal oldLeftIndent = leftIndent;
    const qreal oldTopIndent = topIndent;

    // If the whole scene fits horizontally, we center the scene horizontally,
    // and ignore the horizontal scroll bars.
    const int left =  q_round_bound(viewRect.left());
    const int right = q_round_bound(viewRect.right() - width);
    if (left >= right) {
        switch (alignment & Qt::AlignHorizontal_Mask) {
        case Qt::AlignLeft:
            leftIndent = -viewRect.left();
            break;
        case Qt::AlignRight:
            leftIndent = maxSize.width() - viewRect.width() - viewRect.left() - 1;
            break;
        case Qt::AlignHCenter:
        default:
            leftIndent = maxSize.width() / 2 - (viewRect.left() + viewRect.right()) / 2;
            break;
        }

        hbar->setRange(0, 0);
    } else {
        leftIndent = 0;

        hbar->setRange(left, right);
        hbar->setPageStep(width);
        hbar->setSingleStep(width / 20);

        if (oldLeftIndent != 0)
            hbar->setValue(-oldLeftIndent);
    }

    // If the whole scene fits vertically, we center the scene vertically, and
    // ignore the vertical scroll bars.
    const int top = q_round_bound(viewRect.top());
    const int bottom = q_round_bound(viewRect.bottom()  - height);
    if (top >= bottom) {
        switch (alignment & Qt::AlignVertical_Mask) {
        case Qt::AlignTop:
            topIndent = -viewRect.top();
            break;
        case Qt::AlignBottom:
            topIndent = maxSize.height() - viewRect.height() - viewRect.top() - 1;
            break;
        case Qt::AlignVCenter:
        default:
            topIndent = maxSize.height() / 2 - (viewRect.top() + viewRect.bottom()) / 2;
            break;
        }

        vbar->setRange(0, 0);
    } else {
        topIndent = 0;

        vbar->setRange(top, bottom);
        vbar->setPageStep(height);
        vbar->setSingleStep(height / 20);

        if (oldTopIndent != 0)
            vbar->setValue(-oldTopIndent);
    }

    // Restorethe center point from before the ranges changed.
    lastCenterPoint = savedLastCenterPoint;

    // Issue a full update if the indents change.
    // ### If the transform is still the same, we can get away with just a
    // scroll instead.
    if (oldLeftIndent != leftIndent || oldTopIndent != topIndent) {
        dirtyScroll = true;
        updateAll();
    } else if (q->isRightToLeft() && !leftIndent) {
        // In reverse mode, the horizontal scroll always changes after the content
        // size has changed, as the scroll is calculated by summing the min and
        // max values of the range and subtracting the current value. In normal
        // mode the scroll remains unchanged unless the indent has changed.
        dirtyScroll = true;
    }

    if (cacheMode & QGraphicsView::CacheBackground) {
        // Invalidate the background pixmap
        mustResizeBackgroundPixmap = true;
    }
}